

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O1

void GPU_FreeRenderer(GPU_Renderer *renderer)

{
  GPU_RendererEnum GVar1;
  GPU_RendererID id;
  GPU_Renderer *pGVar2;
  long lVar3;
  long lVar4;
  char *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  
  if (renderer == (GPU_Renderer *)0x0) {
    return;
  }
  pGVar2 = GPU_GetCurrentRenderer();
  if (pGVar2 == renderer) {
    GPU_MakeRendererID((GPU_RendererID *)&stack0xffffffffffffffd0,"Unknown",0,0,0);
    id.renderer = (GPU_RendererEnum)in_stack_ffffffffffffffd8;
    id.major_version = SUB84(in_stack_ffffffffffffffd8,4);
    id.name = in_stack_ffffffffffffffd0;
    id.minor_version = (int)in_stack_ffffffffffffffe0;
    id._20_4_ = SUB84(in_stack_ffffffffffffffe0,4);
    GPU_SetCurrentRenderer(id);
  }
  lVar4 = 0;
  while (*(GPU_Renderer **)((long)_gpu_renderer_map + lVar4) != renderer) {
    lVar4 = lVar4 + 8;
    if (lVar4 == 0xa0) {
      return;
    }
  }
  lVar3 = 0x20;
  while ((GVar1 = *(GPU_RendererEnum *)((long)_gpu_renderer_map + lVar3 + 0x88), GVar1 == 0 ||
         ((renderer->id).renderer != GVar1))) {
    lVar3 = lVar3 + 0x28;
    if (lVar3 == 0x1b0) {
LAB_001395b5:
      *(undefined8 *)((long)_gpu_renderer_map + lVar4) = 0;
      return;
    }
  }
  (**(code **)((long)&_gpu_renderer_register[0].id.name + lVar3))(renderer);
  goto LAB_001395b5;
}

Assistant:

void GPU_FreeRenderer(GPU_Renderer* renderer)
{
	int i;
	GPU_Renderer* current_renderer;
	
	if(renderer == NULL)
        return;
	
    current_renderer = GPU_GetCurrentRenderer();
    if(current_renderer == renderer)
        GPU_SetCurrentRenderer(GPU_MakeRendererID("Unknown", GPU_RENDERER_UNKNOWN, 0, 0));
        
	for(i = 0; i < GPU_MAX_ACTIVE_RENDERERS; i++)
	{
		if(renderer == _gpu_renderer_map[i])
		{
			gpu_free_renderer_memory(renderer);
			_gpu_renderer_map[i] = NULL;
			return;
		}
	}
}